

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bigint * __thiscall fmt::v6::internal::bigint::operator<<=(bigint *this,int shift)

{
  uint uVar1;
  byte bVar2;
  size_t sVar3;
  uint *puVar4;
  int in_ESI;
  bigint *in_RDI;
  bigit c;
  size_t n;
  size_t i;
  bigit carry;
  uint *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  ulong local_20;
  uint local_18;
  
  in_RDI->exp_ = in_ESI / 0x20 + in_RDI->exp_;
  if (in_ESI % 0x20 != 0) {
    local_18 = 0;
    local_20 = 0;
    sVar3 = buffer<unsigned_int>::size((buffer<unsigned_int> *)in_RDI);
    for (; local_20 < sVar3; local_20 = local_20 + 1) {
      puVar4 = buffer<unsigned_int>::operator[]<unsigned_long>
                         ((buffer<unsigned_int> *)in_RDI,local_20);
      uVar1 = *puVar4;
      bVar2 = (byte)(in_ESI % 0x20);
      puVar4 = buffer<unsigned_int>::operator[]<unsigned_long>
                         ((buffer<unsigned_int> *)in_RDI,local_20);
      in_stack_ffffffffffffffc4 = (*puVar4 << (bVar2 & 0x1f)) + local_18;
      puVar4 = buffer<unsigned_int>::operator[]<unsigned_long>
                         ((buffer<unsigned_int> *)in_RDI,local_20);
      *puVar4 = in_stack_ffffffffffffffc4;
      local_18 = uVar1 >> (0x20 - bVar2 & 0x1f);
    }
    if (local_18 != 0) {
      buffer<unsigned_int>::push_back
                ((buffer<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
    }
  }
  return in_RDI;
}

Assistant:

bigint& operator<<=(int shift) {
    assert(shift >= 0);
    exp_ += shift / bigit_bits;
    shift %= bigit_bits;
    if (shift == 0) return *this;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      bigit c = bigits_[i] >> (bigit_bits - shift);
      bigits_[i] = (bigits_[i] << shift) + carry;
      carry = c;
    }
    if (carry != 0) bigits_.push_back(carry);
    return *this;
  }